

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

int gzip_bidder_init(archive_read_filter *self)

{
  void *__ptr;
  void *__ptr_00;
  void *out_block;
  private_data_conflict1 *state;
  archive_read_filter *self_local;
  
  self->code = 1;
  self->name = "gzip";
  __ptr = calloc(0xa0,1);
  __ptr_00 = malloc(0x10000);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    free(__ptr_00);
    free(__ptr);
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for gzip decompression");
    self_local._4_4_ = -0x1e;
  }
  else {
    self->data = __ptr;
    *(undefined8 *)((long)__ptr + 0x80) = 0x10000;
    *(void **)((long)__ptr + 0x78) = __ptr_00;
    self->read = gzip_filter_read;
    self->skip = (_func_int64_t_archive_read_filter_ptr_int64_t *)0x0;
    self->close = gzip_filter_close;
    *(undefined1 *)((long)__ptr + 0x70) = 0;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
gzip_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	static const size_t out_block_size = 64 * 1024;
	void *out_block;

	self->code = ARCHIVE_FILTER_GZIP;
	self->name = "gzip";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		free(out_block);
		free(state);
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for gzip decompression");
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->read = gzip_filter_read;
	self->skip = NULL; /* not supported */
	self->close = gzip_filter_close;

	state->in_stream = 0; /* We're not actually within a stream yet. */

	return (ARCHIVE_OK);
}